

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_1x1.h
# Opt level: O0

void ncnn::conv1x1s2_sse(Mat *bottom_blob,Mat *top_blob,Mat *_kernel,Mat *_bias,Option *opt)

{
  float fVar1;
  float *pfVar2;
  Mat *in_RCX;
  Mat *in_RDX;
  long in_RSI;
  long in_RDI;
  float sum_1;
  int remain_1;
  int i_1;
  float *r0_1;
  float k0_1;
  float *kernel0_1;
  float *img0_1;
  float *outptr_1;
  float sum3;
  float sum2;
  float sum1;
  float sum;
  int remain;
  int i;
  float *r3;
  float *r2;
  float *r1;
  float *r0;
  float k3;
  float k2;
  float k1;
  float k0;
  float *kernel0;
  float *img3;
  float *img2;
  float *img1;
  float *img0;
  float *outptr;
  int q;
  float bias0;
  Mat out;
  int p;
  float *bias;
  float *kernel;
  int tailstep;
  int outch;
  int outh;
  int outw;
  int inch;
  int w;
  float *in_stack_fffffffffffffd10;
  int _c;
  Mat *in_stack_fffffffffffffd18;
  Mat *in_stack_fffffffffffffd20;
  float local_2a0;
  int local_298;
  int local_294;
  float *local_290;
  Mat local_278;
  float *local_238;
  Mat *local_230;
  float local_228;
  float local_224;
  float local_220;
  float local_21c;
  int local_218;
  int local_214;
  Mat *local_210;
  float *local_208;
  float *local_200;
  float *local_1f8;
  float local_1f0;
  float local_1ec;
  float local_1e8;
  float local_1e4;
  float *local_1e0;
  Mat local_1d8;
  Mat *local_198;
  Mat local_190;
  float *local_150;
  Mat local_148;
  float *local_108;
  Mat local_100;
  float *local_c0;
  float *local_a8;
  int local_a0;
  float local_9c;
  Mat local_98;
  int local_54;
  float *local_50;
  float *local_48;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  Mat *local_20;
  
  local_2c = *(int *)(in_RDI + 0x2c);
  local_30 = *(int *)(in_RDI + 0x34);
  local_34 = *(int *)(in_RSI + 0x2c);
  local_38 = *(int *)(in_RSI + 0x30);
  local_3c = *(int *)(in_RSI + 0x34);
  local_40 = local_2c * 2 + local_34 * -2;
  local_20 = in_RCX;
  local_48 = Mat::operator_cast_to_float_(in_RDX);
  local_50 = Mat::operator_cast_to_float_(local_20);
  for (local_54 = 0; local_54 < local_3c; local_54 = local_54 + 1) {
    Mat::channel(in_stack_fffffffffffffd18,(int)((ulong)in_stack_fffffffffffffd10 >> 0x20));
    if (local_50 == (float *)0x0) {
      local_2a0 = 0.0;
    }
    else {
      local_2a0 = local_50[local_54];
    }
    local_9c = local_2a0;
    Mat::fill(in_stack_fffffffffffffd20,(float)((ulong)in_stack_fffffffffffffd18 >> 0x20));
    for (local_a0 = 0; local_a0 + 3 < local_30; local_a0 = local_a0 + 4) {
      local_a8 = Mat::operator_cast_to_float_(&local_98);
      Mat::channel(in_stack_fffffffffffffd18,(int)((ulong)in_stack_fffffffffffffd10 >> 0x20));
      pfVar2 = Mat::operator_cast_to_float_(&local_100);
      Mat::~Mat((Mat *)0x13cf88);
      local_c0 = pfVar2;
      Mat::channel(in_stack_fffffffffffffd18,(int)((ulong)in_stack_fffffffffffffd10 >> 0x20));
      pfVar2 = Mat::operator_cast_to_float_(&local_148);
      Mat::~Mat((Mat *)0x13cfd6);
      local_108 = pfVar2;
      Mat::channel(in_stack_fffffffffffffd18,(int)((ulong)in_stack_fffffffffffffd10 >> 0x20));
      pfVar2 = Mat::operator_cast_to_float_(&local_190);
      Mat::~Mat((Mat *)0x13d025);
      local_150 = pfVar2;
      Mat::channel(in_stack_fffffffffffffd18,(int)((ulong)in_stack_fffffffffffffd10 >> 0x20));
      in_stack_fffffffffffffd20 = (Mat *)Mat::operator_cast_to_float_(&local_1d8);
      Mat::~Mat((Mat *)0x13d072);
      local_1e0 = local_48 + (long)(local_54 * local_30) + (long)local_a0;
      local_1e4 = *local_1e0;
      local_1e8 = local_1e0[1];
      local_1ec = local_1e0[2];
      local_1f0 = local_1e0[3];
      local_1f8 = local_c0;
      local_200 = local_108;
      local_208 = local_150;
      local_210 = in_stack_fffffffffffffd20;
      for (local_214 = 0; local_214 < local_38; local_214 = local_214 + 1) {
        for (local_218 = local_34; 0 < local_218; local_218 = local_218 + -1) {
          local_21c = *local_1f8 * local_1e4;
          local_220 = *local_200 * local_1e8;
          local_224 = *local_208 * local_1ec;
          local_228 = *(float *)&local_210->data * local_1f0;
          *local_a8 = local_21c + local_220 + local_224 + local_228 + *local_a8;
          local_1f8 = local_1f8 + 2;
          local_200 = local_200 + 2;
          local_208 = local_208 + 2;
          local_210 = (Mat *)&local_210->refcount;
          local_a8 = local_a8 + 1;
        }
        local_1f8 = local_1f8 + local_40;
        local_200 = local_200 + local_40;
        local_208 = local_208 + local_40;
        local_210 = (Mat *)((long)&local_210->data + (long)local_40 * 4);
      }
      local_198 = in_stack_fffffffffffffd20;
    }
    for (; _c = (int)((ulong)in_stack_fffffffffffffd10 >> 0x20), local_a0 < local_30;
        local_a0 = local_a0 + 1) {
      in_stack_fffffffffffffd18 = (Mat *)Mat::operator_cast_to_float_(&local_98);
      local_230 = in_stack_fffffffffffffd18;
      Mat::channel(in_stack_fffffffffffffd18,_c);
      in_stack_fffffffffffffd10 = Mat::operator_cast_to_float_(&local_278);
      Mat::~Mat((Mat *)0x13d3fb);
      fVar1 = local_48[(long)(local_54 * local_30) + (long)local_a0];
      local_290 = in_stack_fffffffffffffd10;
      for (local_294 = 0; local_294 < local_38; local_294 = local_294 + 1) {
        for (local_298 = local_34; 0 < local_298; local_298 = local_298 + -1) {
          *(float *)&local_230->data = *local_290 * fVar1 + *(float *)&local_230->data;
          local_290 = local_290 + 2;
          local_230 = (Mat *)((long)&local_230->data + 4);
        }
        local_290 = local_290 + local_40;
      }
      local_238 = in_stack_fffffffffffffd10;
    }
    Mat::~Mat((Mat *)0x13d52e);
  }
  return;
}

Assistant:

static void conv1x1s2_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& _kernel, const Mat& _bias, const Option& opt)
{
    int w = bottom_blob.w;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const int tailstep = w - 2*outw + w;

    const float* kernel = _kernel;
    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p=0; p<outch; p++)
    {
        Mat out = top_blob.channel(p);

        const float bias0 = bias ? bias[p] : 0.f;

        out.fill(bias0);

        int q = 0;

        for (; q+3<inch; q+=4)
        {
            float* outptr = out;

            const float* img0 = bottom_blob.channel(q);
            const float* img1 = bottom_blob.channel(q+1);
            const float* img2 = bottom_blob.channel(q+2);
            const float* img3 = bottom_blob.channel(q+3);

            const float* kernel0 = kernel + p*inch + q;
            const float k0 = kernel0[0];
            const float k1 = kernel0[1];
            const float k2 = kernel0[2];
            const float k3 = kernel0[3];

            const float* r0 = img0;
            const float* r1 = img1;
            const float* r2 = img2;
            const float* r3 = img3;

            for (int i = 0; i < outh; i++)
            {
                int remain = outw;

                for (; remain>0; remain--)
                {
                    float sum = *r0 * k0;
                    float sum1 = *r1 * k1;
                    float sum2 = *r2 * k2;
                    float sum3 = *r3 * k3;

                    *outptr += sum + sum1 + sum2 + sum3;

                    r0 += 2;
                    r1 += 2;
                    r2 += 2;
                    r3 += 2;
                    outptr++;
                }

                r0 += tailstep;
                r1 += tailstep;
                r2 += tailstep;
                r3 += tailstep;
            }

        }

        for (; q<inch; q++)
        {
            float* outptr = out;

            const float* img0 = bottom_blob.channel(q);

            const float* kernel0 = kernel + p*inch + q;
            const float k0 = kernel0[0];

            const float* r0 = img0;

            for (int i = 0; i < outh; i++)
            {
                int remain = outw;

                for (; remain>0; remain--)
                {
                    float sum = *r0 * k0;

                    *outptr += sum;

                    r0 += 2;
                    outptr++;
                }

                r0 += tailstep;
            }

        }
    }

}